

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall
DLevelScript::DoSpawnSpotFacing(DLevelScript *this,int type,int spot,int tid,bool force)

{
  bool bVar1;
  int iVar2;
  AActor *pAVar3;
  TAngle<double> local_80;
  DVector3 local_78;
  TAngle<double> local_60;
  DVector3 local_58;
  AActor *local_40;
  AActor *aspot;
  FActorIterator iterator;
  int spawned;
  bool force_local;
  int tid_local;
  int spot_local;
  int type_local;
  DLevelScript *this_local;
  
  iterator._12_4_ = 0;
  if (spot == 0) {
    bVar1 = TObjPtr<AActor>::operator!=(&this->activator,(AActor *)0x0);
    if (bVar1) {
      pAVar3 = TObjPtr<AActor>::operator->(&this->activator);
      AActor::Pos(&local_78,pAVar3);
      pAVar3 = TObjPtr<AActor>::operator->(&this->activator);
      TAngle<double>::TAngle(&local_80,&(pAVar3->Angles).Yaw);
      iVar2 = DoSpawn(type,&local_78,tid,&local_80,force);
      iterator._12_4_ = iVar2 + iterator._12_4_;
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)&aspot,spot);
    while (local_40 = FActorIterator::Next((FActorIterator *)&aspot), local_40 != (AActor *)0x0) {
      AActor::Pos(&local_58,local_40);
      TAngle<double>::TAngle(&local_60,&(local_40->Angles).Yaw);
      iVar2 = DoSpawn(type,&local_58,tid,&local_60,force);
      iterator._12_4_ = iVar2 + iterator._12_4_;
    }
  }
  return iterator._12_4_;
}

Assistant:

int DLevelScript::DoSpawnSpotFacing (int type, int spot, int tid, bool force)
{
	int spawned = 0;

	if (spot != 0)
	{
		FActorIterator iterator (spot);
		AActor *aspot;

		while ( (aspot = iterator.Next ()) )
		{
			spawned += DoSpawn (type, aspot->Pos(), tid, aspot->Angles.Yaw, force);
		}
	}
	else if (activator != NULL)
	{
			spawned += DoSpawn (type, activator->Pos(), tid, activator->Angles.Yaw, force);
	}
	return spawned;
}